

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O0

char * Curl_netrc_strerror(NETRCcode ret)

{
  char *pcStack_10;
  NETRCcode ret_local;
  
  switch(ret) {
  case NETRC_NO_MATCH:
    pcStack_10 = "no matching entry";
    break;
  case NETRC_SYNTAX_ERROR:
    pcStack_10 = "syntax error";
    break;
  case NETRC_FILE_MISSING:
    pcStack_10 = "no such file";
    break;
  case NETRC_OUT_OF_MEMORY:
    pcStack_10 = "out of memory";
    break;
  default:
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

const char *Curl_netrc_strerror(NETRCcode ret)
{
  switch(ret) {
  default:
    return ""; /* not a legit error */
  case NETRC_FILE_MISSING:
    return "no such file";
  case NETRC_NO_MATCH:
    return "no matching entry";
  case NETRC_OUT_OF_MEMORY:
    return "out of memory";
  case NETRC_SYNTAX_ERROR:
    return "syntax error";
  }
  /* never reached */
}